

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stun_msg.c
# Opt level: O0

char * stun_err_reason(int err_code)

{
  char *local_20;
  char *local_18;
  char *msg;
  int i;
  int err_code_local;
  
  local_18 = (char *)0x0;
  msg._0_4_ = 0;
  do {
    if (0x10 < (uint)msg) {
LAB_0016b322:
      if (local_18 == (char *)0x0) {
        local_20 = "???";
      }
      else {
        local_20 = local_18;
      }
      return local_20;
    }
    if (err_msg_map[(int)(uint)msg].err_code == err_code) {
      local_18 = err_msg_map[(int)(uint)msg].err_msg;
      goto LAB_0016b322;
    }
    msg._0_4_ = (uint)msg + 1;
  } while( true );
}

Assistant:

const char *stun_err_reason(int err_code) {
  int i;
  const char *msg = NULL;
  for (i = 0; i < sizeof(err_msg_map) / sizeof(err_msg_map[0]); i++) {
    if (err_msg_map[i].err_code == err_code) {
      msg = err_msg_map[i].err_msg;
      break;
    }
  }
  /* Avoiding to return NULL for unknown codes */
  return (msg == NULL) ? "???" : msg;
}